

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void phmap::
     erase_if<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,phmap::priv::(anonymous_namespace)::Btree_EraseIf_Test::TestBody()::__3>
               (btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
                *map)

{
  bool bVar1;
  reference ppVar2;
  iterator iVar3;
  iterator local_48;
  btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *local_38;
  int local_30;
  undefined1 auStack_28 [8];
  iterator it;
  btree_multimap<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *map_local
  ;
  
  it._8_8_ = map;
  iVar3 = priv::
          btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
          ::begin(map);
  local_38 = iVar3.node;
  local_30 = iVar3.position;
  auStack_28 = (undefined1  [8])local_38;
  it.node._0_4_ = local_30;
  while( true ) {
    iVar3 = priv::
            btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
            ::end((btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
                   *)it._8_8_);
    local_48.node = iVar3.node;
    local_48.position = iVar3.position;
    bVar1 = priv::
            btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
            ::operator!=((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                          *)auStack_28,&local_48);
    if (!bVar1) break;
    ppVar2 = priv::
             btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
             ::operator*((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                          *)auStack_28);
    bVar1 = priv::anon_unknown_0::Btree_EraseIf_Test::TestBody::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&map_local + 7),*ppVar2);
    if (bVar1) {
      iVar3.position = (int)it.node;
      iVar3.node = (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                    *)auStack_28;
      iVar3._12_4_ = 0;
      iVar3 = priv::
              btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
              ::erase((btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
                       *)it._8_8_,iVar3);
      auStack_28 = (undefined1  [8])iVar3.node;
      it.node._0_4_ = iVar3.position;
    }
    else {
      priv::
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
      ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                    *)auStack_28);
    }
  }
  return;
}

Assistant:

void erase_if(btree_multimap<K, V, C, A> &map, Pred pred) {
        for (auto it = map.begin(); it != map.end();) {
            if (pred(*it)) {
                it = map.erase(it);
            } else {
                ++it;
            }
        }
    }